

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::kotlin::FieldGenerator::GenerateRepeatedMessageField
          (FieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  string_view text;
  string_view text_00;
  allocator<char> local_411;
  JvmNameContext name_ctx;
  undefined1 local_3f8 [64];
  __index_type local_3b8;
  _Alloc_hider local_3b0;
  size_type local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  bool local_390;
  bool local_348;
  char *local_340;
  size_type local_338;
  char local_330 [8];
  undefined8 uStack_328;
  char *local_320;
  size_type local_318;
  char local_310 [8];
  undefined8 uStack_308;
  char *local_300;
  size_type local_2f8;
  char local_2f0 [8];
  undefined8 uStack_2e8;
  char *local_2e0;
  size_type local_2d8;
  char local_2d0 [8];
  undefined8 uStack_2c8;
  char *local_2c0;
  size_type local_2b8;
  char local_2b0 [8];
  undefined8 uStack_2a8;
  char *local_2a0;
  size_type local_298;
  char local_290 [8];
  undefined8 uStack_288;
  _Any_data local_280;
  code *local_270;
  code *local_268;
  Options local_260;
  Options local_210;
  Options local_1c0;
  Options local_170;
  Options local_120;
  Options local_d0;
  Options local_80;
  
  name_ctx.options = &this->context_->options_;
  name_ctx.lite = this->lite_;
  text._M_str = 
  "/**\n * An uninstantiable, behaviorless type to represent the field in\n * generics.\n */\n@kotlin.OptIn(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\npublic class ${$$kt_capitalized_name$Proxy$}$ private constructor() : com.google.protobuf.kotlin.DslProxy()\n"
  ;
  text._M_len = 0x113;
  name_ctx.printer = printer;
  io::Printer::Print<>(printer,text);
  pFVar1 = this->descriptor_;
  java::Options::Options(&local_80,&this->context_->options_);
  java::WriteFieldDocComment(printer,pFVar1,&local_80,true);
  java::Options::~Options(&local_80);
  text_00._M_str =
       "$kt_deprecation$ public val $kt_name$: com.google.protobuf.kotlin.DslList<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>\n$  jvm_synthetic$  get() = com.google.protobuf.kotlin.DslList(\n    $kt_dsl_builder$.${$$kt_property_name$List$}$\n  )\n"
  ;
  text_00._M_len = 0xec;
  io::Printer::Print<>(printer,text_00);
  pFVar1 = this->descriptor_;
  java::Options::Options(&local_d0,&this->context_->options_);
  java::WriteFieldAccessorDocComment(printer,pFVar1,LIST_ADDER,&local_d0,false,true,false);
  java::Options::~Options(&local_d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"jvm_name",&local_411);
  local_3f8._0_8_ = local_3f8 + 0x10;
  if (local_2a0 == local_290) {
    local_3f8._24_8_ = uStack_288;
  }
  else {
    local_3f8._0_8_ = local_2a0;
  }
  local_3f8._8_8_ = local_298;
  local_298 = 0;
  local_280._8_8_ = 0;
  local_290[0] = '\0';
  local_280._M_unused._M_object = &name_ctx;
  local_268 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_270 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_2a0 = local_290;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_3f8 + 0x20),
             (function<bool_()> *)&local_280);
  std::_Function_base::~_Function_base((_Function_base *)&local_280);
  local_3a8 = 0;
  local_3a0._M_local_buf[0] = '\0';
  local_390 = false;
  local_3b0._M_p = (pointer)&local_3a0;
  if (local_3b8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_3b0);
  }
  local_348 = false;
  io::Printer::Emit(printer,local_3f8,1,0xc4);
  io::Printer::Sub::~Sub((Sub *)local_3f8);
  std::__cxx11::string::~string((string *)&local_2a0);
  pFVar1 = this->descriptor_;
  java::Options::Options(&local_120,&this->context_->options_);
  java::WriteFieldAccessorDocComment(printer,pFVar1,LIST_ADDER,&local_120,false,true,false);
  java::Options::~Options(&local_120);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"jvm_name",&local_411);
  local_3f8._8_8_ = local_2b8;
  local_3f8._0_8_ = local_3f8 + 0x10;
  if (local_2c0 == local_2b0) {
    local_3f8._24_8_ = uStack_2a8;
  }
  else {
    local_3f8._0_8_ = local_2c0;
  }
  local_2b8 = 0;
  local_2b0[0] = '\0';
  local_280._8_8_ = 0;
  local_280._M_unused._M_object = &name_ctx;
  local_268 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_270 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_2c0 = local_2b0;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_3f8 + 0x20),
             (function<bool_()> *)&local_280);
  std::_Function_base::~_Function_base((_Function_base *)&local_280);
  local_3a8 = 0;
  local_3a0._M_local_buf[0] = '\0';
  local_390 = false;
  local_3b0._M_p = (pointer)&local_3a0;
  if (local_3b8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_3b0);
  }
  local_348 = false;
  io::Printer::Emit(printer,local_3f8,1,0xd1);
  io::Printer::Sub::~Sub((Sub *)local_3f8);
  std::__cxx11::string::~string((string *)&local_2c0);
  pFVar1 = this->descriptor_;
  java::Options::Options(&local_170,&this->context_->options_);
  java::WriteFieldAccessorDocComment(printer,pFVar1,LIST_MULTI_ADDER,&local_170,false,true,false);
  java::Options::~Options(&local_170);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"jvm_name",&local_411);
  local_3f8._8_8_ = local_2d8;
  local_3f8._0_8_ = local_3f8 + 0x10;
  if (local_2e0 == local_2d0) {
    local_3f8._24_8_ = uStack_2c8;
  }
  else {
    local_3f8._0_8_ = local_2e0;
  }
  local_2d8 = 0;
  local_2d0[0] = '\0';
  local_280._8_8_ = 0;
  local_280._M_unused._M_object = &name_ctx;
  local_268 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_270 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_2e0 = local_2d0;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_3f8 + 0x20),
             (function<bool_()> *)&local_280);
  std::_Function_base::~_Function_base((_Function_base *)&local_280);
  local_3a8 = 0;
  local_3a0._M_local_buf[0] = '\0';
  local_390 = false;
  local_3b0._M_p = (pointer)&local_3a0;
  if (local_3b8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_3b0);
  }
  local_348 = false;
  io::Printer::Emit(printer,local_3f8,1,0xe9);
  io::Printer::Sub::~Sub((Sub *)local_3f8);
  std::__cxx11::string::~string((string *)&local_2e0);
  pFVar1 = this->descriptor_;
  java::Options::Options(&local_1c0,&this->context_->options_);
  java::WriteFieldAccessorDocComment(printer,pFVar1,LIST_MULTI_ADDER,&local_1c0,false,true,false);
  java::Options::~Options(&local_1c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"jvm_name",&local_411);
  local_3f8._8_8_ = local_2f8;
  local_3f8._0_8_ = local_3f8 + 0x10;
  if (local_300 == local_2f0) {
    local_3f8._24_8_ = uStack_2e8;
  }
  else {
    local_3f8._0_8_ = local_300;
  }
  local_2f8 = 0;
  local_2f0[0] = '\0';
  local_280._8_8_ = 0;
  local_280._M_unused._M_object = &name_ctx;
  local_268 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_270 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_300 = local_2f0;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_3f8 + 0x20),
             (function<bool_()> *)&local_280);
  std::_Function_base::~_Function_base((_Function_base *)&local_280);
  local_3a8 = 0;
  local_3a0._M_local_buf[0] = '\0';
  local_390 = false;
  local_3b0._M_p = (pointer)&local_3a0;
  if (local_3b8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_3b0);
  }
  local_348 = false;
  io::Printer::Emit(printer,local_3f8,1,0xf3);
  io::Printer::Sub::~Sub((Sub *)local_3f8);
  std::__cxx11::string::~string((string *)&local_300);
  pFVar1 = this->descriptor_;
  java::Options::Options(&local_210,&this->context_->options_);
  java::WriteFieldAccessorDocComment(printer,pFVar1,LIST_INDEXED_SETTER,&local_210,false,true,false)
  ;
  java::Options::~Options(&local_210);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"jvm_name",&local_411);
  local_3f8._8_8_ = local_318;
  local_3f8._0_8_ = local_3f8 + 0x10;
  if (local_320 == local_310) {
    local_3f8._24_8_ = uStack_308;
  }
  else {
    local_3f8._0_8_ = local_320;
  }
  local_318 = 0;
  local_310[0] = '\0';
  local_280._8_8_ = 0;
  local_280._M_unused._M_object = &name_ctx;
  local_268 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_270 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_320 = local_310;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_3f8 + 0x20),
             (function<bool_()> *)&local_280);
  std::_Function_base::~_Function_base((_Function_base *)&local_280);
  local_3a8 = 0;
  local_3a0._M_local_buf[0] = '\0';
  local_390 = false;
  local_3b0._M_p = (pointer)&local_3a0;
  if (local_3b8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_3b0);
  }
  local_348 = false;
  io::Printer::Emit(printer,local_3f8,1,0xe7);
  io::Printer::Sub::~Sub((Sub *)local_3f8);
  std::__cxx11::string::~string((string *)&local_320);
  pFVar1 = this->descriptor_;
  java::Options::Options(&local_260,&this->context_->options_);
  java::WriteFieldAccessorDocComment(printer,pFVar1,CLEARER,&local_260,false,true,false);
  java::Options::~Options(&local_260);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"jvm_name",&local_411);
  local_3f8._8_8_ = local_338;
  local_3f8._0_8_ = local_3f8 + 0x10;
  if (local_340 == local_330) {
    local_3f8._24_8_ = uStack_328;
  }
  else {
    local_3f8._0_8_ = local_340;
  }
  local_338 = 0;
  local_330[0] = '\0';
  local_280._8_8_ = 0;
  local_280._M_unused._M_object = &name_ctx;
  local_268 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_270 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_340 = local_330;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_3f8 + 0x20),
             (function<bool_()> *)&local_280);
  std::_Function_base::~_Function_base((_Function_base *)&local_280);
  local_3a8 = 0;
  local_3a0._M_local_buf[0] = '\0';
  local_390 = false;
  local_3b0._M_p = (pointer)&local_3a0;
  if (local_3b8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_3b0);
  }
  local_348 = false;
  io::Printer::Emit(printer,local_3f8,1,0xb3,
                    "$jvm_synthetic$$jvm_name$public fun com.google.protobuf.kotlin.DslList<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>.clear() {\n  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n}\n"
                   );
  io::Printer::Sub::~Sub((Sub *)local_3f8);
  std::__cxx11::string::~string((string *)&local_340);
  return;
}

Assistant:

void FieldGenerator::GenerateRepeatedMessageField(io::Printer* printer) const {
  java::JvmNameContext name_ctx = {context_->options(), printer, lite_};
  printer->Print(
      "/**\n"
      " * An uninstantiable, behaviorless type to represent the field in\n"
      " * generics.\n"
      " */\n"
      "@kotlin.OptIn"
      "(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\n"
      "public class ${$$kt_capitalized_name$Proxy$}$ private constructor()"
      " : com.google.protobuf.kotlin.DslProxy()\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Print(
      "$kt_deprecation$ public val $kt_name$: "
      "com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "$  jvm_synthetic$"
      "  get() = com.google.protobuf.kotlin.DslList(\n"
      "    $kt_dsl_builder$.${$$kt_property_name$List$}$\n"
      "  )\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::LIST_ADDER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name", [&] { JvmName("add$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "add(value: $kt_type$) {\n"
      "  $kt_dsl_builder$.${$add$capitalized_name$$}$(value)\n"
      "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::LIST_ADDER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("plusAssign$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "@Suppress(\"NOTHING_TO_INLINE\")\n"
      "public inline operator fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "plusAssign(value: $kt_type$) {\n"
      "  add(value)\n"
      "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::LIST_MULTI_ADDER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("addAll$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "addAll(values: kotlin.collections.Iterable<$kt_type$>) {\n"
      "  $kt_dsl_builder$.${$addAll$capitalized_name$$}$(values)\n"
      "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::LIST_MULTI_ADDER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("plusAssignAll$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "@Suppress(\"NOTHING_TO_INLINE\")\n"
      "public inline operator fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "plusAssign(values: kotlin.collections.Iterable<$kt_type$>) {\n"
      "  addAll(values)\n"
      "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::LIST_INDEXED_SETTER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name", [&] { JvmName("set$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public operator fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "set(index: kotlin.Int, value: $kt_type$) {\n"
      "  $kt_dsl_builder$.${$set$capitalized_name$$}$(index, value)\n"
      "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::CLEARER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("clear$kt_capitalized_name$", name_ctx); }},
      },

      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "clear() {\n"
      "  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n"
      "}\n");
}